

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  Location loc_00;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auStack_60 [8];
  Location loc;
  string end_label;
  
  GetLocation((Location *)auStack_60,this);
  loc.field_1._8_8_ = &end_label._M_string_length;
  end_label._M_dataplus._M_p = (pointer)0x0;
  end_label._M_string_length._0_1_ = 0;
  RVar2 = ParseLabelOpt(this,(string *)((long)&loc.field_1 + 8));
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Ok;
    if (end_label._M_dataplus._M_p != (pointer)0x0) {
      if (begin_label->_M_string_length == 0) {
        EVar3 = Ok;
        Error(this,0x101f3f3,(char *)loc.field_1._8_8_);
      }
      else {
        bVar1 = std::operator!=(begin_label,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&loc.field_1 + 8));
        EVar3 = Ok;
        if (bVar1) {
          EVar3 = Ok;
          loc_00.filename.data_._4_4_ = auStack_60._4_4_;
          loc_00.filename.data_._0_4_ = auStack_60._0_4_;
          loc_00.filename.size_._0_4_ = loc.filename.data_._0_4_;
          loc_00.filename.size_._4_4_ = loc.filename.data_._4_4_;
          loc_00.field_1.field_0.line = (undefined4)loc.filename.size_;
          loc_00.field_1.field_0.first_column = loc.filename.size_._4_4_;
          loc_00.field_1.field_0.last_column = loc.field_1.field_0.line;
          loc_00.field_1._12_4_ = loc.field_1.field_0.first_column;
          Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",(begin_label->_M_dataplus)._M_p,
                loc.field_1._8_8_,in_R8,in_R9);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}